

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void gl4cts::EnhancedLayouts::Utils::insertElementOfList
               (GLchar *element,GLchar *separator,size_t *search_position,string *string)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  size_t start_position;
  size_t sep_list_position;
  size_t list_position;
  string *string_local;
  size_t *search_position_local;
  GLchar *separator_local;
  GLchar *element_local;
  
  lVar2 = std::__cxx11::string::find((char *)string,(ulong)insertElementOfList::list);
  lVar3 = std::__cxx11::string::find((char *)string,(ulong)insertElementOfList::sep_list);
  if (lVar2 != -1) {
    if (lVar2 - lVar3 == 9) {
      replaceToken("SEPARATOR",search_position,separator,string);
    }
    sVar1 = *search_position;
    replaceToken("LIST",search_position,"ELEMENTSEPARATORLIST",string);
    *search_position = sVar1;
    replaceToken("ELEMENT",search_position,element,string);
  }
  return;
}

Assistant:

void insertElementOfList(const GLchar* element, const GLchar* separator, size_t& search_position, std::string& string)
{
	static const char* list		= g_list;
	static const char* sep_list = "SEPARATORLIST";

	/* Try to get "list" positions */
	const size_t list_position	 = string.find(list, search_position);
	const size_t sep_list_position = string.find(sep_list, search_position);

	/* There is no list in string */
	if (std::string::npos == list_position)
	{
		return;
	}

	if (9 /* strlen(SEPARATOR) */ == list_position - sep_list_position)
	{
		replaceToken("SEPARATOR", search_position, separator, string);
	}

	/* Save search_position */
	const size_t start_position = search_position;

	/* Prepare new element */
	replaceToken("LIST", search_position, "ELEMENTSEPARATORLIST", string);

	/* Restore search_position */
	search_position = start_position;

	/* Replace element and separator */
	replaceToken("ELEMENT", search_position, element, string);
}